

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmAddEaRg<(moira::Instr)118,(moira::Mode)8,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  char cVar4;
  uint uVar5;
  char *pcVar6;
  StrWriter *pSVar7;
  long lVar8;
  uint uVar9;
  Ea<(moira::Mode)8,_(moira::Size)4> src;
  Ea<(moira::Mode)8,_(moira::Size)4> local_3c;
  
  local_3c.reg = op & 7;
  local_3c.pc = *addr;
  *addr = local_3c.pc + 2;
  local_3c.ext1 = (*this->_vptr_Moira[5])();
  local_3c.ext1 = local_3c.ext1 & 0xffff;
  uVar9 = local_3c.ext1 << 0x10;
  *addr = *addr + 2;
  uVar5 = (*this->_vptr_Moira[5])(this);
  local_3c.ext1 = uVar5 & 0xffff | uVar9;
  pcVar6 = "sub";
  if (str->upper != false) {
    pcVar6 = "SUB";
  }
  cVar4 = *pcVar6;
  while (cVar4 != '\0') {
    pcVar6 = pcVar6 + 1;
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar4;
    cVar4 = *pcVar6;
  }
  if (str->upper == false) {
    cVar4 = '.';
    lVar8 = 0;
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar4;
      cVar4 = ".l"[lVar8 + 1];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 2);
  }
  else {
    cVar4 = '.';
    lVar8 = 0;
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar4;
      cVar4 = ".L"[lVar8 + 1];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 2);
  }
  iVar1 = (this->tab).raw;
  while (pcVar6 = str->ptr, pcVar6 < str->base + iVar1) {
    str->ptr = pcVar6 + 1;
    *pcVar6 = ' ';
  }
  pSVar7 = StrWriter::operator<<(str,&local_3c);
  cVar4 = ',';
  lVar8 = 0;
  do {
    pcVar6 = pSVar7->ptr;
    pSVar7->ptr = pcVar6 + 1;
    *pcVar6 = cVar4;
    cVar4 = "), "[lVar8 + 2];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 2);
  pcVar6 = pSVar7->ptr;
  pSVar7->ptr = pcVar6 + 1;
  *pcVar6 = 'D';
  pbVar3 = (byte *)pSVar7->ptr;
  pSVar7->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (byte)(op >> 9) & 7 | 0x30;
  return;
}

Assistant:

void
Moira::dasmAddEaRg(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = Dn       ( ____xxx_________(op)       );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}